

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>
::ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest> *this,
          char *name,CodeLocation *code_location)

{
  string *psVar1;
  CodeLocation *in_RDX;
  char *in_RSI;
  CodeLocation *in_RDI;
  allocator local_19 [9];
  char *local_10;
  
  local_10 = in_RSI;
  ParameterizedTestSuiteInfoBase::ParameterizedTestSuiteInfoBase
            ((ParameterizedTestSuiteInfoBase *)in_RDI);
  *(undefined ***)&in_RDI->file = &PTR__ParameterizedTestSuiteInfo_01f41540;
  psVar1 = &in_RDI->file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&psVar1->_M_string_length,local_10,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  CodeLocation::CodeLocation(in_RDI,in_RDX);
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::TestInfo>_>_>
  ::vector((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::TestInfo>_>_>
            *)0x45d8dd);
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::InstantiationInfo>_>
  ::vector((vector<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<libaom_test::AV1HiprecConvolve::AV1HiprecConvolveTest>::InstantiationInfo>_>
            *)0x45d8eb);
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(const char* name,
                                      CodeLocation code_location)
      : test_suite_name_(name), code_location_(code_location) {}